

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O0

void TestPUMADP_histOptions(Arguments *args)

{
  ostream *poVar1;
  ProblemDecTiger *this;
  long in_RDI;
  TestPU pu;
  TestPU pu_all;
  ProblemDecTiger pdt;
  PlanningUnitMADPDiscreteParameters params;
  int h;
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffff6c8;
  size_t in_stack_fffffffffffff6d0;
  PlanningUnitMADPDiscreteParameters *in_stack_fffffffffffff6d8;
  TestPU *in_stack_fffffffffffff6e0;
  undefined8 local_8f8;
  undefined1 local_8f0;
  undefined8 local_5b8;
  undefined1 local_5b0;
  ProblemDecTiger local_278;
  undefined8 local_15;
  undefined1 local_d;
  undefined4 local_c;
  long local_8;
  
  local_c = 3;
  local_8 = in_RDI;
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_15);
  poVar1 = std::operator<<((ostream *)&std::cout,"TestPUMADP_histOptions ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"---------------------- ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ProblemDecTiger::ProblemDecTiger(&local_278);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&local_15,0));
  local_5b0 = local_d;
  local_5b8 = local_15;
  TestPU::TestPU(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff6c8);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_5b8);
  poVar1 = std::operator<<((ostream *)&std::cout,"->Planning Unit with everything generated");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"-----------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PlanningUnitMADPDiscrete::Print();
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&local_15,0));
  local_8f0 = local_d;
  local_8f8 = local_15;
  TestPU::TestPU(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
                 in_stack_fffffffffffff6c8);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_8f8);
  poVar1 = std::operator<<((ostream *)&std::cout,"->Planning Unit with nothing generated");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PlanningUnitMADPDiscrete::Print();
  poVar1 = std::operator<<((ostream *)&std::cout,"TestPUMADP_histOptions ended ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this = (ProblemDecTiger *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"press <enter> to continue...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::istream::get();
  }
  TestPU::~TestPU((TestPU *)0x12196e);
  TestPU::~TestPU((TestPU *)0x12197b);
  ProblemDecTiger::~ProblemDecTiger(this);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_15);
  return;
}

Assistant:

void  TestPUMADP_histOptions(const ArgumentHandlers::Arguments& args)
{
    int h = 3;
    PlanningUnitMADPDiscreteParameters params;

    cout << "TestPUMADP_histOptions "<<endl;
    cout << "---------------------- "<<endl;
    ProblemDecTiger pdt;
   params.SetComputeAll(true);
    TestPU pu_all (params, h, &pdt);
    cout << "->Planning Unit with everything generated"<< endl;
    cout << "-----------------------------------------"<< endl;
    pu_all.Print();

    params.SetComputeAll(false);
    TestPU pu (params, h, &pdt);
    cout << "->Planning Unit with nothing generated"<< endl;
    cout << "--------------------------------------"<< endl;
    pu.Print();
    cout << "TestPUMADP_histOptions ended "<<endl<<endl<<endl<<endl<<endl;

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
}